

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_keypair_xonly_pub
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pubkey,int *pk_parity,
              secp256k1_keypair *keypair)

{
  int iVar1;
  long lVar2;
  secp256k1_ge *psVar3;
  secp256k1_ge *psVar4;
  bool bVar5;
  byte bVar6;
  secp256k1_ge pk;
  secp256k1_ge_storage s;
  secp256k1_ge sStack_a8;
  secp256k1_ge_storage local_50;
  
  bVar6 = 0;
  if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_keypair_xonly_pub_cold_2();
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (keypair == (secp256k1_keypair *)0x0) {
      secp256k1_keypair_xonly_pub_cold_1();
    }
    else {
      iVar1 = secp256k1_pubkey_load
                        (ctx,&sStack_a8,(secp256k1_pubkey_conflict *)(keypair->data + 0x20));
      if (iVar1 != 0) {
        bVar5 = (sStack_a8.y.n[0] & 1) != 0;
        if (bVar5) {
          sStack_a8.y.n[0] = 0x3ffffbfffff0bc - sStack_a8.y.n[0];
          sStack_a8.y.n[1] = 0x3ffffffffffffc - sStack_a8.y.n[1];
          sStack_a8.y.n[2] = 0x3ffffffffffffc - sStack_a8.y.n[2];
          sStack_a8.y.n[3] = 0x3ffffffffffffc - sStack_a8.y.n[3];
          sStack_a8.y.n[4] = 0x3fffffffffffc - sStack_a8.y.n[4];
        }
        if (pk_parity != (int *)0x0) {
          *pk_parity = (uint)bVar5;
        }
        secp256k1_ge_to_storage(&local_50,&sStack_a8);
        *(uint64_t *)(pubkey->data + 0x30) = local_50.y.n[2];
        *(uint64_t *)(pubkey->data + 0x38) = local_50.y.n[3];
        *(uint64_t *)(pubkey->data + 0x20) = local_50.y.n[0];
        *(uint64_t *)(pubkey->data + 0x28) = local_50.y.n[1];
        *(uint64_t *)(pubkey->data + 0x10) = local_50.x.n[2];
        *(uint64_t *)(pubkey->data + 0x18) = local_50.x.n[3];
        *(uint64_t *)pubkey->data = local_50.x.n[0];
        *(uint64_t *)(pubkey->data + 8) = local_50.x.n[1];
        return 1;
      }
      psVar3 = &secp256k1_ge_const_g;
      psVar4 = &sStack_a8;
      for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(uint64_t *)psVar4 = (psVar3->x).n[0];
        psVar3 = (secp256k1_ge *)((long)psVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        psVar4 = (secp256k1_ge *)((long)psVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_keypair_xonly_pub(const secp256k1_context* ctx, secp256k1_xonly_pubkey *pubkey, int *pk_parity, const secp256k1_keypair *keypair) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(keypair != NULL);

    if (!secp256k1_keypair_load(ctx, NULL, &pk, keypair)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(pubkey, &pk);

    return 1;
}